

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkAddDummyPoNames(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  pVVar3 = pNtk->vPos;
  uVar1 = pVVar3->nSize;
  uVar4 = uVar1;
  if (1 < uVar1) {
    uVar6 = (ulong)(uVar1 - 1);
    uVar4 = 0;
    do {
      uVar5 = (uint)uVar6;
      uVar6 = uVar6 / 10;
      uVar4 = uVar4 + 1;
    } while (9 < uVar5);
  }
  if (0 < (int)uVar1) {
    lVar7 = 0;
    do {
      plVar2 = (long *)pVVar3->pArray[lVar7];
      sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d","po",(ulong)uVar4);
      Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2],
                        *(uint *)((long)plVar2 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0);
      lVar7 = lVar7 + 1;
      pVVar3 = pNtk->vPos;
    } while (lVar7 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkAddDummyPoNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nDigits, i;
    nDigits = Abc_Base10Log( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("po", i, nDigits), NULL );
}